

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[34],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],unsigned_long_const&,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
          (CWriter *this,StackVar *t,char (*u) [34],StackVar *args,char (*args_1) [3],
          unsigned_long *args_2,char (*args_3) [3],StackVar *args_4,char (*args_5) [3],
          Newline *args_6)

{
  string_view local_48;
  unsigned_long *local_38;
  unsigned_long *args_local_2;
  char (*args_local_1) [3];
  StackVar *args_local;
  char (*u_local) [34];
  StackVar *t_local;
  CWriter *this_local;
  
  local_38 = args_2;
  args_local_2 = (unsigned_long *)args_1;
  args_local_1 = (char (*) [3])args;
  args_local = (StackVar *)u;
  u_local = (char (*) [34])t;
  t_local = (StackVar *)this;
  anon_unknown_0::CWriter::Write((CWriter *)this,t);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,(char *)args_local);
  anon_unknown_0::CWriter::Write((CWriter *)this,local_48);
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],unsigned_long_const&,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            (this,(StackVar *)args_local_1,(char (*) [3])args_local_2,local_38,args_3,args_4,args_5,
             args_6);
  return;
}

Assistant:

void Write(T&& t, U&& u, Args&&... args) {
    Write(std::forward<T>(t));
    Write(std::forward<U>(u));
    Write(std::forward<Args>(args)...);
  }